

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::jsonToHeap
          (Interpreter *this,unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *v
          ,bool *filled,Value *attach)

{
  JsonnetJsonValue *pJVar1;
  HeapEntity *pHVar2;
  long lVar3;
  Allocator *this_00;
  HeapThunk *pHVar4;
  mapped_type *ppHVar5;
  _Base_ptr p_Var6;
  anon_union_8_3_4e909c26_for_v aVar7;
  int *args_2;
  _Rb_tree_node_base *attach_00;
  size_t i;
  int *piVar8;
  void **in_R8;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *args_3;
  long lVar9;
  Value VVar10;
  Identifier *local_e0;
  UString local_d8;
  HeapEntity *local_b0;
  Identifier **local_a8;
  _Rb_tree_node_base *local_a0;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  local_98;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  local_68;
  
  pJVar1 = (v->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
           ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
           super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl;
  switch(pJVar1->kind) {
  case ARRAY:
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    VVar10 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                             *)&local_d8);
    attach->t = ARRAY;
    attach->v = VVar10._0_8_;
    std::
    _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::~_Vector_base((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)&local_d8);
    *filled = true;
    pHVar2 = (attach->v).h;
    lVar9 = 0;
    for (piVar8 = (int *)0x0;
        pJVar1 = (v->_M_t).
                 super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
                 super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl,
        args_2 = (int *)((long)*(pointer *)
                                ((long)&(pJVar1->elements).
                                        super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                                + 8) -
                         *(long *)&(pJVar1->elements).
                                   super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                                   ._M_impl >> 3), piVar8 < args_2;
        piVar8 = (int *)((long)piVar8 + 1)) {
      local_e0 = (Identifier *)((ulong)local_e0 & 0xffffffff00000000);
      local_d8._M_dataplus._M_p =
           (pointer)(anonymous_namespace)::Interpreter::
                    makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                              ((Interpreter *)this,&this->idArrayElement,&local_e0,args_2,in_R8);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)(pHVar2 + 1),(value_type *)&local_d8);
      lVar3 = *(long *)((long)pHVar2[1]._vptr_HeapEntity + lVar9);
      jsonToHeap(this,(unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                      (*(long *)&(((v->_M_t).
                                   super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>
                                   .super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl)->
                                 elements).
                                 super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                                 ._M_impl + lVar9),(bool *)(lVar3 + 10),(Value *)(lVar3 + 0x10));
      lVar9 = lVar9 + 8;
    }
    return;
  case BOOL:
    aVar7._0_4_ = -(uint)(pJVar1->number != 0.0) & 1;
    aVar7._4_4_ = 0;
    attach->t = BOOLEAN;
    goto LAB_001866c2;
  case NULL_KIND:
    attach->t = NULL_TYPE;
    break;
  case NUMBER:
    aVar7 = (anon_union_8_3_4e909c26_for_v)pJVar1->number;
    attach->t = NUMBER;
LAB_001866c2:
    attach->v = aVar7;
    break;
  case OBJECT:
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68._M_t._M_impl._0_8_ = 0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98._M_t._M_impl._0_8_ = 0;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    args_3 = &local_98;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    VVar10 = (anonymous_namespace)::Interpreter::
             makeObject<jsonnet::internal::(anonymous_namespace)::HeapComprehensionObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,jsonnet::internal::AST_const*,jsonnet::internal::Identifier_const*,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>>
                       ((Interpreter *)this,&local_68,this->jsonObjVar,this->idJsonObjVar,args_3);
    local_a8 = &this->idJsonObjVar;
    attach->t = OBJECT;
    attach->v = VVar10._0_8_;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map(&local_98);
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map(&local_68);
    *filled = true;
    pJVar1 = (v->_M_t).
             super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>._M_t.
             super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
             super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl;
    attach_00 = (_Rb_tree_node_base *)((long)&(pJVar1->fields)._M_t + 8);
    local_b0 = (attach->v).h + 5;
    local_a0 = attach_00;
    for (p_Var6 = *(_Base_ptr *)((long)&(pJVar1->fields)._M_t + 0x18); p_Var6 != local_a0;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffff00000000;
      pHVar4 = (anonymous_namespace)::Interpreter::
               makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                         ((Interpreter *)this,local_a8,(void **)&local_d8,(int *)attach_00,
                          (void **)args_3);
      this_00 = this->alloc;
      decode_utf8(&local_d8,(string *)(p_Var6 + 1));
      local_e0 = Allocator::makeIdentifier(this_00,&local_d8);
      ppHVar5 = std::
                map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                              *)local_b0,&local_e0);
      *ppHVar5 = pHVar4;
      std::__cxx11::u32string::~u32string((u32string *)&local_d8);
      attach_00 = (_Rb_tree_node_base *)&pHVar4->content;
      jsonToHeap(this,(unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                      (p_Var6 + 2),(bool *)&(pHVar4->super_HeapEntity).field_0xa,(Value *)attach_00)
      ;
    }
    return;
  case STRING:
    decode_utf8(&local_d8,&pJVar1->string);
    VVar10 = makeString(this,&local_d8);
    attach->t = STRING;
    attach->v = VVar10._0_8_;
    std::__cxx11::u32string::~u32string((u32string *)&local_d8);
    break;
  default:
    goto switchD_0018649e_default;
  }
  *filled = true;
switchD_0018649e_default:
  return;
}

Assistant:

void jsonToHeap(const std::unique_ptr<JsonnetJsonValue> &v, bool &filled, Value &attach)
    {
        // In order to not anger the garbage collector, assign to attach immediately after
        // making the heap object.
        switch (v->kind) {
            case JsonnetJsonValue::STRING:
                attach = makeString(decode_utf8(v->string));
                filled = true;
                break;

            case JsonnetJsonValue::BOOL:
                attach = makeBoolean(v->number != 0.0);
                filled = true;
                break;

            case JsonnetJsonValue::NUMBER:
                attach = makeNumber(v->number);
                filled = true;
                break;

            case JsonnetJsonValue::NULL_KIND:
                attach = makeNull();
                filled = true;
                break;

            case JsonnetJsonValue::ARRAY: {
                attach = makeArray(std::vector<HeapThunk *>{});
                filled = true;
                auto *arr = static_cast<HeapArray *>(attach.v.h);
                for (size_t i = 0; i < v->elements.size(); ++i) {
                    arr->elements.push_back(
                        makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr));
                    jsonToHeap(v->elements[i], arr->elements[i]->filled, arr->elements[i]->content);
                }
            } break;

            case JsonnetJsonValue::OBJECT: {
                attach = makeObject<HeapComprehensionObject>(
                    BindingFrame{}, jsonObjVar, idJsonObjVar, BindingFrame{});
                filled = true;
                auto *obj = static_cast<HeapComprehensionObject *>(attach.v.h);
                for (const auto &pair : v->fields) {
                    auto *thunk = makeHeap<HeapThunk>(idJsonObjVar, nullptr, 0, nullptr);
                    obj->compValues[alloc->makeIdentifier(decode_utf8(pair.first))] = thunk;
                    jsonToHeap(pair.second, thunk->filled, thunk->content);
                }
            } break;
        }
    }